

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[11],unsigned_long,char[15],unsigned_int,char[19],char_const*,char[14],char_const*,char[29],std::__cxx11::string,char[108]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [11],unsigned_long *RestArgs,char (*RestArgs_1) [15],
               uint *RestArgs_2,char (*RestArgs_3) [19],char **RestArgs_4,char (*RestArgs_5) [14],
               char **RestArgs_6,char (*RestArgs_7) [29],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *RestArgs_8,
               char (*RestArgs_9) [108])

{
  char (*RestArgs_local_3) [19];
  uint *RestArgs_local_2;
  char (*RestArgs_local_1) [15];
  unsigned_long *RestArgs_local;
  char (*FirstArg_local) [11];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  FormatStrSS<std::__cxx11::stringstream,char[11]>(ss,FirstArg);
  FormatStrSS<std::__cxx11::stringstream,unsigned_long,char[15],unsigned_int,char[19],char_const*,char[14],char_const*,char[29],std::__cxx11::string,char[108]>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5,RestArgs_6,
             RestArgs_7,RestArgs_8,RestArgs_9);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}